

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O1

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  k051649_state *info;
  DEV_DATA DVar2;
  uint uVar3;
  long lVar4;
  
  DVar2.chipInf = calloc(1,0xf0);
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(UINT8 *)((long)DVar2.chipInf + 0xee) = cfg->flags;
    uVar3 = cfg->clock;
    *(uint *)((long)DVar2.chipInf + 0xe4) = uVar3;
    uVar3 = uVar3 >> 4;
    *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0xe8))->chipInf = uVar3;
    lVar4 = 0x32;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar4) = 0;
      lVar4 = lVar4 + 0x2c;
    } while (lVar4 != 0x10e);
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar3;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}